

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

GatherLayerParams * __thiscall
CoreML::Specification::GatherLayerParams::New(GatherLayerParams *this,Arena *arena)

{
  GatherLayerParams *this_00;
  
  this_00 = (GatherLayerParams *)operator_new(0x20);
  GatherLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::GatherLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

GatherLayerParams* GatherLayerParams::New(::google::protobuf::Arena* arena) const {
  GatherLayerParams* n = new GatherLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}